

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O2

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<sampleslevelRec*,std::vector<sampleslevelRec,std::allocator<sampleslevelRec>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (undefined8 *__result,int *__a,int *__b,int *__c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  undefined8 uVar8;
  
  fVar1 = (float)__a[1];
  fVar2 = (float)__b[1];
  iVar4 = *__a;
  iVar5 = *__b;
  bVar7 = iVar4 < iVar5;
  if (fVar1 != fVar2) {
    bVar7 = fVar1 < fVar2;
  }
  if (NAN(fVar1) || NAN(fVar2)) {
    bVar7 = fVar1 < fVar2;
  }
  fVar3 = (float)__c[1];
  iVar6 = *__c;
  if (bVar7) {
    bVar7 = iVar5 < iVar6;
    if (fVar2 != fVar3) {
      bVar7 = fVar2 < fVar3;
    }
    if (NAN(fVar2) || NAN(fVar3)) {
      bVar7 = fVar2 < fVar3;
    }
    if (!bVar7) {
      bVar7 = iVar4 < iVar6;
      if (fVar1 != fVar3) {
        bVar7 = fVar1 < fVar3;
      }
      if (NAN(fVar1) || NAN(fVar3)) {
        bVar7 = fVar1 < fVar3;
      }
      uVar8 = *__result;
      if (bVar7) {
LAB_001054d1:
        *__result = *(undefined8 *)__c;
        *(undefined8 *)__c = uVar8;
        return;
      }
LAB_001054a0:
      *__result = *(undefined8 *)__a;
      *(undefined8 *)__a = uVar8;
      return;
    }
    uVar8 = *__result;
  }
  else {
    bVar7 = iVar4 < iVar6;
    if (fVar1 != fVar3) {
      bVar7 = fVar1 < fVar3;
    }
    if (NAN(fVar1) || NAN(fVar3)) {
      bVar7 = fVar1 < fVar3;
    }
    if (bVar7) {
      uVar8 = *__result;
      goto LAB_001054a0;
    }
    bVar7 = iVar5 < iVar6;
    if (fVar2 != fVar3) {
      bVar7 = fVar2 < fVar3;
    }
    if (NAN(fVar2) || NAN(fVar3)) {
      bVar7 = fVar2 < fVar3;
    }
    uVar8 = *__result;
    if (bVar7) goto LAB_001054d1;
  }
  *__result = *(undefined8 *)__b;
  *(undefined8 *)__b = uVar8;
  return;
}

Assistant:

bool operator<(const sampleslevelRec &lhs, const sampleslevelRec &rhs) {
	if (lhs.loss != rhs.loss) {
		return lhs.loss < rhs.loss;
	} else {
		return lhs.sidx < rhs.sidx;
	}
}